

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::diveTable
          (AVisitor<hiberlite::ExtractModel> *this,string *name)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  pushAndSubTable(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AVisitor<Vis>::diveTable(std::string name){
	pushAndSubTable(name);
}